

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::url_seed_alert::url_seed_alert
          (url_seed_alert *this,stack_allocator *alloc,torrent_handle *h,string_view u,string_view m
          )

{
  string_view str;
  allocation_slot aVar1;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  url_seed_alert *this_local;
  string_view u_local;
  
  u_local.ptr_ = (char *)u.len_;
  this_local = (url_seed_alert *)u.ptr_;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__url_seed_alert_00991dc0;
  boost::system::error_code::error_code(&this->error);
  str.len_ = (size_t)u_local.ptr_;
  str.ptr_ = (char *)this_local;
  aVar1 = libtorrent::aux::stack_allocator::copy_string(alloc,str);
  (this->m_url_idx).m_idx = aVar1.m_idx;
  aVar1 = libtorrent::aux::stack_allocator::copy_string(alloc,m);
  (this->m_msg_idx).m_idx = aVar1.m_idx;
  boost::basic_string_view::operator_cast_to_string(&this->url,(basic_string_view *)&this_local);
  boost::basic_string_view::operator_cast_to_string(&this->msg,(basic_string_view *)&m);
  return;
}

Assistant:

url_seed_alert::url_seed_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, string_view u, string_view m)
		: torrent_alert(alloc, h)
		, m_url_idx(alloc.copy_string(u))
		, m_msg_idx(alloc.copy_string(m))
#if TORRENT_ABI_VERSION == 1
		, url(u)
		, msg(m)
#endif
	{}